

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

bool __thiscall ThreadContext::DoTryRedeferral(ThreadContext *this)

{
  RedeferralState RVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ThreadContext *this_local;
  
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,RedeferralPhase);
  if ((bVar3) || (bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea7040,RedeferralPhase), bVar3)) {
    return true;
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,RedeferralPhase);
  if (bVar3) {
    return false;
  }
  RVar1 = this->redeferralState;
  if (RVar1 != InitialRedeferralState) {
    if (RVar1 == StartupRedeferralState) {
      return 4 < this->gcSinceCallCountsCollected;
    }
    if (RVar1 != MainRedeferralState) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0xa94,"(0)","0");
      if (bVar3) {
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
        return false;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    return 9 < this->gcSinceCallCountsCollected;
  }
  return false;
}

Assistant:

bool
ThreadContext::DoTryRedeferral() const
{
    if (PHASE_FORCE1(Js::RedeferralPhase) || PHASE_STRESS1(Js::RedeferralPhase))
    {
        return true;
    }

    if (PHASE_OFF1(Js::RedeferralPhase))
    {
        return false;
    }

    switch (this->redeferralState)
    {
        case InitialRedeferralState:
            return false;

        case StartupRedeferralState:
            return gcSinceCallCountsCollected >= StartupRedeferralInactiveThreshold;

        case MainRedeferralState:
            return gcSinceCallCountsCollected >= MainRedeferralInactiveThreshold;

        default:
            Assert(0);
            return false;
    };
}